

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32
drwav_init_file_write__internal_FILE
          (drwav *pWav,FILE *pFile,drwav_data_format *pFormat,drwav_uint64 totalSampleCount,
          drwav_bool32 isSequential,drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_bool32 dVar1;
  drwav_seek_proc in_RCX;
  drwav_write_proc in_RDX;
  FILE *in_RSI;
  drwav_data_format *in_RDI;
  undefined4 in_R8D;
  drwav_data_format *unaff_retaddr;
  drwav *in_stack_00000008;
  drwav_bool32 result;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  dVar1 = drwav_preinit_write((drwav *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                              ,in_RDI,(drwav_bool32)((ulong)in_RSI >> 0x20),in_RDX,in_RCX,
                              (void *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                              pAllocationCallbacks);
  if (dVar1 == 1) {
    dVar1 = drwav_init_write__internal
                      (in_stack_00000008,unaff_retaddr,
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (dVar1 == 1) {
      dVar1 = 1;
    }
    else {
      fclose(in_RSI);
    }
  }
  else {
    fclose(in_RSI);
  }
  return dVar1;
}

Assistant:

static drwav_bool32 drwav_init_file_write__internal_FILE(drwav* pWav, FILE* pFile, const drwav_data_format* pFormat, drwav_uint64 totalSampleCount, drwav_bool32 isSequential, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    drwav_bool32 result;

    result = drwav_preinit_write(pWav, pFormat, isSequential, drwav__on_write_stdio, drwav__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (result != DRWAV_TRUE) {
        fclose(pFile);
        return result;
    }

    result = drwav_init_write__internal(pWav, pFormat, totalSampleCount);
    if (result != DRWAV_TRUE) {
        fclose(pFile);
        return result;
    }

    return DRWAV_TRUE;
}